

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Severity.hpp
# Opt level: O0

cx_string<4UL> binlog::severityToString(Severity severity)

{
  cx_string<4UL> cVar1;
  short in_DI;
  cx_string<4UL> local_5;
  
  if (in_DI == -0x8000) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"NOLG");
  }
  else if (in_DI == 0x20) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"TRAC");
  }
  else if (in_DI == 0x40) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"DEBG");
  }
  else if (in_DI == 0x80) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"INFO");
  }
  else if (in_DI == 0x100) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"WARN");
  }
  else if (in_DI == 0x200) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"ERRO");
  }
  else if (in_DI == 0x400) {
    mserialize::cx_string<4UL>::cx_string(&local_5,"CRIT");
  }
  else {
    mserialize::cx_string<4UL>::cx_string(&local_5,"UNKW");
  }
  cVar1._data[4] = local_5._data[4];
  cVar1._data[0] = local_5._data[0];
  cVar1._data[1] = local_5._data[1];
  cVar1._data[2] = local_5._data[2];
  cVar1._data[3] = local_5._data[3];
  return (cx_string<4UL>)cVar1._data;
}

Assistant:

inline mserialize::cx_string<4> severityToString(Severity severity)
{
  switch (severity)
  {
    case Severity::trace:    return mserialize::cx_string<4>{"TRAC"};
    case Severity::debug:    return mserialize::cx_string<4>{"DEBG"};
    case Severity::info:     return mserialize::cx_string<4>{"INFO"};
    case Severity::warning:  return mserialize::cx_string<4>{"WARN"};
    case Severity::error:    return mserialize::cx_string<4>{"ERRO"};
    case Severity::critical: return mserialize::cx_string<4>{"CRIT"};
    case Severity::no_logs:  return mserialize::cx_string<4>{"NOLG"};
    default:                 return mserialize::cx_string<4>{"UNKW"};
  }
}